

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O3

void __thiscall embree::Device::setProperty(Device *this,RTCDeviceProperty prop,ssize_t val)

{
  undefined8 *puVar1;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  if (prop - 1000000 < 4) {
    *(ssize_t *)(&PTR_debug_int0_021849b0)[prop - 1000000] = val;
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"unknown writable property","");
  *puVar1 = &PTR__rtcore_error_02184a18;
  *(undefined4 *)(puVar1 + 1) = 2;
  puVar1[2] = puVar1 + 4;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_38,local_38 + local_30);
  __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

void Device::setProperty(const RTCDeviceProperty prop, ssize_t val)
  {
    /* hidden internal properties */
    switch ((size_t)prop)
    {
    case 1000000: debug_int0 = val; return;
    case 1000001: debug_int1 = val; return;
    case 1000002: debug_int2 = val; return;
    case 1000003: debug_int3 = val; return;
    }

    throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "unknown writable property");
  }